

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::FontSpecsOf<sciplot::AxisLabelSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,FontSpecsOf<sciplot::AxisLabelSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  if ((this->m_fontsize)._M_string_length != 0 || (this->m_fontname)._M_string_length != 0) {
    poVar1 = std::operator<<(local_188,"font \'");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_fontname);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_fontsize);
    std::operator<<(poVar1,"\'");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

auto FontSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::stringstream ss;
    if(m_fontname.size() || m_fontsize.size())
        ss << "font '" << m_fontname << "," << m_fontsize << "'";
    return ss.str();
}